

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSendActionAsync(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                       char *DevUDN_const,IXML_Document *Act,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char *buffer;
  job_arg *arg;
  char *ServiceType;
  char *ActionURL;
  char *tmpStr;
  UpnpNonblockParam *Param;
  Handle_Info *SInfo;
  ThreadPoolJob job;
  int rc;
  Upnp_FunPtr Fun_local;
  IXML_Document *Act_local;
  char *DevUDN_const_local;
  char *ServiceType_const_local;
  char *ActionURL_const_local;
  UpnpClient_Handle Hnd_local;
  
  Param = (UpnpNonblockParam *)0x0;
  memset(&SInfo,0,0x30);
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xbc5,"Inside UpnpSendActionAsync\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0xbc8);
    UVar1 = GetHandleInfo(Hnd,(Handle_Info **)&Param);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xbd0);
      if (ActionURL_const == (char *)0x0) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else if ((((ServiceType_const == (char *)0x0) || (Act == (IXML_Document *)0x0)) ||
               (Fun == (Upnp_FunPtr)0x0)) || (DevUDN_const != (char *)0x0)) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else {
        buffer = ixmlPrintNode(&Act->n);
        if (buffer == (char *)0x0) {
          ActionURL_const_local._4_4_ = -0x73;
        }
        else {
          arg = (job_arg *)malloc(0x760);
          if (arg == (job_arg *)0x0) {
            ixmlFreeDOMString(buffer);
            ActionURL_const_local._4_4_ = -0x68;
          }
          else {
            memset(arg,0,0x760);
            (arg->advertise).handle = 4;
            (arg->advertise).eventId = Hnd;
            strncpy((arg->action).Url,ActionURL_const,0xff);
            strncpy((arg->action).ServiceType,ServiceType_const,0xff);
            job.jobId = ixmlParseBufferEx(buffer,&(arg->action).Act);
            if (job.jobId == 0) {
              ixmlFreeDOMString(buffer);
              (arg->action).Cookie = (char *)Cookie_const;
              (arg->action).Fun = Fun;
              TPJobInit((ThreadPoolJob *)&SInfo,UpnpThreadDistribution,arg);
              TPJobSetFreeFunction((ThreadPoolJob *)&SInfo,free_action_arg);
              TPJobSetPriority((ThreadPoolJob *)&SInfo,MED_PRIORITY);
              iVar2 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)&SInfo,(int *)0x0);
              if (iVar2 != 0) {
                free_action_arg(arg);
              }
              UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc07,
                         "Exiting UpnpSendActionAsync \n");
              ActionURL_const_local._4_4_ = 0;
            }
            else {
              free(arg);
              ixmlFreeDOMString(buffer);
              if (job.jobId == 0x66) {
                ActionURL_const_local._4_4_ = -0x68;
              }
              else {
                ActionURL_const_local._4_4_ = -0x73;
              }
            }
          }
        }
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xbcd);
      ActionURL_const_local._4_4_ = -100;
    }
  }
  else {
    ActionURL_const_local._4_4_ = -0x74;
  }
  return ActionURL_const_local._4_4_;
}

Assistant:

int UpnpSendActionAsync(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Act,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	int rc;
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	DOMString tmpStr;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendActionAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Act == NULL || Fun == NULL ||
		DevUDN_const != NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	tmpStr = ixmlPrintNode((IXML_Node *)Act);
	if (tmpStr == NULL) {
		return UPNP_E_INVALID_ACTION;
	}

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));

	if (Param == NULL) {
		ixmlFreeDOMString(tmpStr);
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = ACTION;
	Param->Handle = Hnd;
	strncpy(Param->Url, ActionURL, sizeof(Param->Url) - 1);
	strncpy(Param->ServiceType,
		ServiceType,
		sizeof(Param->ServiceType) - 1);

	rc = ixmlParseBufferEx(tmpStr, &(Param->Act));
	if (rc != IXML_SUCCESS) {
		free(Param);
		ixmlFreeDOMString(tmpStr);
		if (rc == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}
	ixmlFreeDOMString(tmpStr);
	Param->Cookie = (void *)Cookie_const;
	Param->Fun = Fun;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free_action_arg);

	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free_action_arg((job_arg *)Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendActionAsync \n");

	return UPNP_E_SUCCESS;
}